

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int * __thiscall
JsUtil::
BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  Recycler *pRVar1;
  Recycler *allocator;
  int *piVar2;
  offset_in_Recycler_to_subr AllocFunc;
  TrackAllocData local_40;
  uint local_14;
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_10;
  uint bucketCount_local;
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  pRVar1 = this->alloc;
  local_14 = bucketCount;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&int::typeinfo,0,(ulong)bucketCount,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x447);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  allocator = (Recycler *)
              Memory::_RecyclerAllocatorFunc<Memory::_RecyclerLeafPolicy>::GetAllocFunc();
  piVar2 = Memory::AllocateArray<Memory::Recycler,int,false>
                     ((Memory *)pRVar1,allocator,AllocFunc,(ulong)local_14);
  return piVar2;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }